

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::InitScopeSlotArray(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  uint uVar1;
  Symbol *pSVar2;
  code *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  UINT i;
  PropertyId PVar6;
  undefined4 *puVar7;
  Scope *pSVar8;
  FunctionBody *this_00;
  Recycler *this_01;
  int *ptr;
  ulong uVar9;
  ulong count;
  uint uVar10;
  UINT i_1;
  Symbol *this_02;
  Type TVar11;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  pSVar8 = funcInfo->paramScope;
  uVar1 = funcInfo->bodyScope->scopeSlotCount;
  count = (ulong)uVar1;
  TVar11 = 0;
  if (pSVar8 != (Scope *)0x0) {
    if ((pSVar8->scopeSlotCount != 0) && ((*(uint *)&funcInfo->field_0xb4 & 0x8000) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x717,
                         "(funcInfo->paramScope == nullptr || funcInfo->paramScope->GetScopeSlotCount() == 0 || isSplitScope)"
                         ,
                         "funcInfo->paramScope == nullptr || funcInfo->paramScope->GetScopeSlotCount() == 0 || isSplitScope"
                        );
      if (!bVar5) goto LAB_0075d4f4;
      *puVar7 = 0;
      pSVar8 = funcInfo->paramScope;
      TVar11 = 0;
      if (pSVar8 == (Scope *)0x0) goto LAB_0075d298;
    }
    TVar11 = pSVar8->scopeSlotCount;
  }
LAB_0075d298:
  if (TVar11 != 0 || uVar1 != 0) {
    this_00 = FuncInfo::GetParsedFunctionBody(funcInfo);
    (this_00->super_ParseableFunctionInfo).scopeSlotArraySize = uVar1;
    (this_00->super_ParseableFunctionInfo).paramScopeSlotArraySize = TVar11;
    if (uVar1 != 0) {
      local_70 = (undefined1  [8])&int::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_350e33c;
      data.filename._0_4_ = 0x728;
      data.plusSize = count;
      this_01 = Memory::Recycler::TrackAllocInfo
                          (this->scriptContext->recycler,(TrackAllocData *)local_70);
      ptr = Memory::AllocateArray<Memory::Recycler,int,false>
                      ((Memory *)this_01,(Recycler *)Memory::Recycler::AllocLeafZero,0,count);
      (this_00->super_ParseableFunctionInfo).scopeSlotArraySize = uVar1;
      (this_00->super_ParseableFunctionInfo).paramScopeSlotArraySize = TVar11;
      Js::FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)13,int*>
                ((FunctionProxy *)this_00,ptr);
      if ((((this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x50) == 0x10)
         && ((this_00->super_ParseableFunctionInfo).scopeSlotArraySize != uVar1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x72b,
                           "(!byteCodeFunction->IsReparsed() || byteCodeFunction->WasEverAsmJsMode() || byteCodeFunction->scopeSlotArraySize == scopeSlotCount)"
                           ,"The slot array size is different between debug and non-debug mode");
        if (!bVar5) {
LAB_0075d4f4:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
      for (uVar9 = 0; count != uVar9; uVar9 = uVar9 + 1) {
        ptr[uVar9] = -1;
      }
      pSVar2 = funcInfo->bodyScope->m_symList;
      data._32_8_ = ptr;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      while (this_02 = pSVar2, uVar4 = data._32_8_, this_02 != (Symbol *)0x0) {
        pSVar2 = this_02->next;
        bVar5 = Symbol::NeedsSlotAlloc(this_02,this,funcInfo);
        if (bVar5) {
          uVar10 = this_02->scopeSlot;
          if (uVar10 == 0xffffffff) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x742,"(sym->HasScopeSlot())","sym->HasScopeSlot()");
            if (!bVar5) goto LAB_0075d4f4;
            *puVar7 = 0;
            uVar10 = this_02->scopeSlot;
          }
          PVar6 = Symbol::EnsurePosition(this_02,funcInfo);
          if (((int)uVar10 < 0) || (uVar1 <= uVar10)) {
            Js::Throw::FatalInternalError(-0x7fffbffb);
          }
          *(PropertyId *)(data._32_8_ + (ulong)uVar10 * 4) = PVar6;
        }
      }
      for (uVar9 = 0; count != uVar9; uVar9 = uVar9 + 1) {
        if ((*(int *)(uVar4 + uVar9 * 4) == -1) && (funcInfo->frameObjRegister == 0xffffffff)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x74d,
                             "(propertyIdsForScopeSlotArray[i] != Js::Constants::NoProperty || funcInfo->frameObjRegister != Js::Constants::NoRegister)"
                             ,
                             "propertyIdsForScopeSlotArray[i] != Js::Constants::NoProperty || funcInfo->frameObjRegister != Js::Constants::NoRegister"
                            );
          if (!bVar5) goto LAB_0075d4f4;
          *puVar7 = 0;
        }
      }
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::InitScopeSlotArray(FuncInfo * funcInfo)
{
    // Record slots info for ScopeSlots/ScopeObject.
    uint scopeSlotCount = funcInfo->bodyScope->GetScopeSlotCount();
    bool isSplitScope = !funcInfo->IsBodyAndParamScopeMerged();
    Assert(funcInfo->paramScope == nullptr || funcInfo->paramScope->GetScopeSlotCount() == 0 || isSplitScope);
    uint scopeSlotCountForParamScope = funcInfo->paramScope != nullptr ? funcInfo->paramScope->GetScopeSlotCount() : 0;

    if (scopeSlotCount == 0 && scopeSlotCountForParamScope == 0)
    {
        return;
    }

    Js::FunctionBody *byteCodeFunction = funcInfo->GetParsedFunctionBody();
    if (scopeSlotCount > 0 || scopeSlotCountForParamScope > 0)
    {
        byteCodeFunction->SetScopeSlotArraySizes(scopeSlotCount, scopeSlotCountForParamScope);
    }

    // TODO: Need to add property ids for the case when scopeSlotCountForParamSCope is non-zero
    if (scopeSlotCount)
    {
        Js::PropertyId *propertyIdsForScopeSlotArray = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(), Js::PropertyId, scopeSlotCount);
        byteCodeFunction->SetPropertyIdsForScopeSlotArray(propertyIdsForScopeSlotArray, scopeSlotCount, scopeSlotCountForParamScope);
        AssertMsg(!byteCodeFunction->IsReparsed() || byteCodeFunction->WasEverAsmJsMode() || byteCodeFunction->scopeSlotArraySize == scopeSlotCount,
            "The slot array size is different between debug and non-debug mode");
#if DEBUG
        for (UINT i = 0; i < scopeSlotCount; i++)
        {
            propertyIdsForScopeSlotArray[i] = Js::Constants::NoProperty;
        }
#endif
        auto setPropertyIdForScopeSlotArray =
            [scopeSlotCount, propertyIdsForScopeSlotArray]
            (Js::PropertyId slot, Js::PropertyId propId)
        {
            if (slot < 0 || (uint)slot >= scopeSlotCount)
            {
                Js::Throw::FatalInternalError();
            }
            propertyIdsForScopeSlotArray[slot] = propId;
        };

        auto setPropIdsForScopeSlotArray = [this, funcInfo, setPropertyIdForScopeSlotArray](Symbol *const sym)
        {
            if (sym->NeedsSlotAlloc(this, funcInfo))
            {
                // All properties should get correct propertyId here.
                Assert(sym->HasScopeSlot()); // We can't allocate scope slot now. Any symbol needing scope slot must have allocated it before this point.
                setPropertyIdForScopeSlotArray(sym->GetScopeSlot(), sym->EnsurePosition(funcInfo));
            }
        };

        funcInfo->GetBodyScope()->ForEachSymbol(setPropIdsForScopeSlotArray);

#if DEBUG
        for (UINT i = 0; i < scopeSlotCount; i++)
        {
            Assert(propertyIdsForScopeSlotArray[i] != Js::Constants::NoProperty
                || funcInfo->frameObjRegister != Js::Constants::NoRegister); // ScopeObject may have unassigned entries, e.g. for same-named parameters
        }
#endif
    }
}